

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void EncodeSetOrSequenceOf<BasicOCSPResponse>
               (DerType type,vector<BasicOCSPResponse,_std::allocator<BasicOCSPResponse>_> *in,
               uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  out_of_range *this;
  ulong uVar5;
  code *pcVar6;
  size_t sVar7;
  undefined *puVar8;
  ulong uVar9;
  size_t local_38;
  size_t cbInternal;
  
  local_38 = 0;
  if (*(long *)(in + 8) == *(long *)in) {
    if (cbOut < 2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                ((overflow_error *)this,"Overflow in EncodeSetOrSequenceOf");
      puVar8 = &std::overflow_error::typeinfo;
      pcVar6 = std::overflow_error::~overflow_error;
      goto LAB_0012323d;
    }
    pOut[0] = '\x05';
    pOut[1] = '\0';
    sVar7 = 2;
  }
  else {
    *pOut = (uchar)type;
    sVar3 = GetDataSize<BasicOCSPResponse>(in);
    sVar7 = 2;
    if (sVar3 != 0) {
      sVar7 = sVar3;
    }
    bVar2 = EncodeSize(sVar7,pOut + 1,cbOut - 1,&local_38);
    if (!bVar2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Error in EncodeSize");
      puVar8 = &std::out_of_range::typeinfo;
      pcVar6 = std::out_of_range::~out_of_range;
LAB_0012323d:
      __cxa_throw(this,puVar8,pcVar6);
    }
    sVar7 = local_38 + 1;
    lVar4 = *(long *)in;
    if (*(long *)(in + 8) != lVar4) {
      uVar5 = 0;
      uVar9 = 1;
      do {
        BasicOCSPResponse::Encode
                  ((BasicOCSPResponse *)(uVar5 * 0x1a0 + lVar4),pOut + sVar7,cbOut - sVar7,&local_38
                  );
        sVar7 = sVar7 + local_38;
        lVar4 = *(long *)in;
        uVar5 = (*(long *)(in + 8) - lVar4 >> 5) * 0x4ec4ec4ec4ec4ec5;
        bVar2 = uVar9 <= uVar5;
        lVar1 = uVar5 - uVar9;
        uVar5 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2 && lVar1 != 0);
    }
  }
  *cbUsed = sVar7;
  return;
}

Assistant:

void EncodeSetOrSequenceOf(DerType type, std::vector<T>& in, unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
	size_t cbInternal = 0;
	size_t offset = 0;

	if (in.size() == 0)
	{
		if (cbOut < 2)
			throw std::overflow_error("Overflow in EncodeSetOrSequenceOf");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
		return;
	}

	pOut[0] = static_cast<unsigned char>(type);

	size_t cbVector = GetEncodedSize(in);

	offset = 1;
	if (!EncodeSize(cbVector, pOut + offset, cbOut - offset, cbInternal))
		throw std::out_of_range("Error in EncodeSize");

	offset += cbInternal;

	for (unsigned int i = 0; i < in.size(); ++i)
	{
		in[i].Encode(pOut + offset, cbOut - offset, cbInternal);
		offset += cbInternal;
	}

	cbUsed = offset;
}